

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

bool __thiscall
gguf_reader::read<std::__cxx11::string>
          (gguf_reader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dst,size_t n)

{
  pointer pbVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  int __fd;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(dst,n);
  pbVar1 = (dst->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = (dst->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish == pbVar1;
  if ((!bVar5) && (sVar2 = read(this,(int)pbVar1,__buf,in_RCX), (char)sVar2 != '\0')) {
    iVar4 = 0x20;
    uVar3 = 0;
    __buf_00 = extraout_RDX;
    do {
      uVar3 = uVar3 + 1;
      pbVar1 = (dst->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar5 = (ulong)((long)(dst->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
              uVar3;
      if (bVar5) {
        return bVar5;
      }
      __fd = (int)pbVar1 + iVar4;
      iVar4 = iVar4 + 0x20;
      sVar2 = read(this,__fd,__buf_00,in_RCX);
      __buf_00 = extraout_RDX_00;
    } while ((char)sVar2 != '\0');
  }
  return bVar5;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }